

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__cff_skip_operand(stbtt__buf *b)

{
  byte bVar1;
  stbtt__buf *in_RDI;
  int b0;
  int v;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff4;
  
  bVar1 = stbtt__buf_peek8(in_RDI);
  if (bVar1 < 0x1c) {
    __assert_fail("b0 >= 28",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                  ,0x4b1,"void stbtt__cff_skip_operand(stbtt__buf *)");
  }
  if (bVar1 == 0x1e) {
    stbtt__buf_skip((stbtt__buf *)CONCAT44(in_stack_fffffffffffffff4,0x1e),in_stack_ffffffffffffffec
                   );
    while (in_RDI->cursor < in_RDI->size) {
      bVar1 = stbtt__buf_get8(in_RDI);
      if ((bVar1 & 0xf) == 0xf) {
        return;
      }
      if ((int)(uint)bVar1 >> 4 == 0xf) {
        return;
      }
    }
  }
  else {
    stbtt__cff_int(in_RDI);
  }
  return;
}

Assistant:

static void stbtt__cff_skip_operand(stbtt__buf *b) {
   int v, b0 = stbtt__buf_peek8(b);
   STBTT_assert(b0 >= 28);
   if (b0 == 30) {
      stbtt__buf_skip(b, 1);
      while (b->cursor < b->size) {
         v = stbtt__buf_get8(b);
         if ((v & 0xF) == 0xF || (v >> 4) == 0xF)
            break;
      }
   } else {
      stbtt__cff_int(b);
   }
}